

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_filter.cpp
# Opt level: O1

unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true> __thiscall
duckdb::DynamicTableFilterSet::GetFinalTableFilters
          (DynamicTableFilterSet *this,PhysicalTableScan *scan,
          optional_ptr<duckdb::TableFilterSet,_true> existing_filters)

{
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> _Var1;
  pointer pTVar2;
  pointer pTVar3;
  _Rb_tree_node_base *p_Var4;
  PhysicalTableScan *pPVar5;
  pointer this_00;
  TableFilterSet *in_RCX;
  _Rb_tree_header *p_Var6;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> local_80;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_78;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> local_70;
  _Head_base<0UL,_duckdb::TableFilterSet_*,_false> local_68;
  PhysicalTableScan *local_60;
  optional_ptr<duckdb::TableFilterSet,_true> local_58;
  ColumnIndex local_50;
  
  local_68._M_head_impl = (TableFilterSet *)this;
  local_60 = scan;
  local_58.ptr = in_RCX;
  local_80._M_head_impl = (TableFilterSet *)operator_new(0x30);
  p_Var6 = &(((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
               *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)
   &((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
      *)local_80._M_head_impl)->_M_impl = 0;
  *(undefined8 *)
   &(((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
       *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_header = 0;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header
  ;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_header._M_right =
       &p_Var6->_M_header;
  (((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
     *)local_80._M_head_impl)->_M_impl).super__Rb_tree_header._M_node_count = 0;
  if (in_RCX != (TableFilterSet *)0x0) {
    optional_ptr<duckdb::TableFilterSet,_true>::CheckValid(&local_58);
    p_Var4 = ((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var6 = &((local_58.ptr)->filters)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var6) {
      do {
        pTVar2 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                 ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                               *)&local_80);
        local_50.index = *(idx_t *)(p_Var4 + 1);
        local_50.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_50.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                             *)&p_Var4[1]._M_parent);
        (*pTVar3->_vptr_TableFilter[4])(&local_70,pTVar3);
        TableFilterSet::PushFilter
                  (pTVar2,&local_50,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_70);
        if (local_70._M_head_impl != (TableFilter *)0x0) {
          (*(local_70._M_head_impl)->_vptr_TableFilter[1])();
        }
        local_70._M_head_impl = (TableFilter *)0x0;
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&local_50.child_indexes.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
        p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var6);
    }
  }
  pPVar5 = (PhysicalTableScan *)
           (local_60->super_PhysicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (pPVar5 != (PhysicalTableScan *)0x0) {
    do {
      local_60 = pPVar5;
      pTVar2 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
               ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                             *)&(pPVar5->super_PhysicalOperator).children);
      for (p_Var4 = (pTVar2->filters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pTVar2->filters)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var4)) {
        this_00 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                  ::operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                                *)&local_80);
        local_50.index = *(idx_t *)(p_Var4 + 1);
        local_50.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_50.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_50.child_indexes.
        super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
        super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
                 operator->((unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                             *)&p_Var4[1]._M_parent);
        (*pTVar3->_vptr_TableFilter[4])(&local_78,pTVar3);
        TableFilterSet::PushFilter
                  (this_00,&local_50,
                   (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>
                    *)&local_78);
        if (local_78._M_head_impl != (TableFilter *)0x0) {
          (*(local_78._M_head_impl)->_vptr_TableFilter[1])();
        }
        local_78._M_head_impl = (TableFilter *)0x0;
        ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::~vector
                  (&local_50.child_indexes.
                    super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>);
      }
      pPVar5 = (PhysicalTableScan *)(local_60->super_PhysicalOperator)._vptr_PhysicalOperator;
    } while (pPVar5 != (PhysicalTableScan *)0x0);
  }
  pTVar2 = unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>::
           operator->((unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>,_true>
                       *)&local_80);
  if ((pTVar2->filters)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    *(undefined8 *)&((local_68._M_head_impl)->filters)._M_t._M_impl = 0;
  }
  else {
    *(TableFilterSet **)&((local_68._M_head_impl)->filters)._M_t._M_impl = local_80._M_head_impl;
    local_80._M_head_impl = (TableFilterSet *)0x0;
  }
  _Var1._M_head_impl = local_80._M_head_impl;
  if ((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
       *)local_80._M_head_impl !=
      (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
       *)0x0) {
    ::std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
                 *)local_80._M_head_impl);
    operator_delete(_Var1._M_head_impl);
  }
  return (unique_ptr<duckdb::TableFilterSet,_std::default_delete<duckdb::TableFilterSet>_>)
         (_Tuple_impl<0UL,_duckdb::TableFilterSet_*,_std::default_delete<duckdb::TableFilterSet>_>)
         local_68._M_head_impl;
}

Assistant:

unique_ptr<TableFilterSet>
DynamicTableFilterSet::GetFinalTableFilters(const PhysicalTableScan &scan,
                                            optional_ptr<TableFilterSet> existing_filters) const {
	D_ASSERT(HasFilters());
	auto result = make_uniq<TableFilterSet>();
	if (existing_filters) {
		for (auto &entry : existing_filters->filters) {
			result->PushFilter(ColumnIndex(entry.first), entry.second->Copy());
		}
	}
	for (auto &entry : filters) {
		for (auto &filter : entry.second->filters) {
			result->PushFilter(ColumnIndex(filter.first), filter.second->Copy());
		}
	}
	if (result->filters.empty()) {
		return nullptr;
	}
	return result;
}